

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  TargetType TVar1;
  cmGlobalGenerator *this_00;
  string f;
  Names targetNames;
  string local_100;
  string dir;
  
  if (this->Target->IsImportedTarget != false) {
    return;
  }
  this_00 = this->LocalGenerator->GlobalGenerator;
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  targetNames.Base._M_string_length = 0;
  targetNames.Base.field_2._M_local_buf[0] = '\0';
  targetNames.Output._M_dataplus._M_p = (pointer)&targetNames.Output.field_2;
  targetNames.Output._M_string_length = 0;
  targetNames.Output.field_2._M_local_buf[0] = '\0';
  targetNames.Real._M_dataplus._M_p = (pointer)&targetNames.Real.field_2;
  targetNames.Real._M_string_length = 0;
  targetNames.Real.field_2._M_local_buf[0] = '\0';
  targetNames.ImportLibrary._M_dataplus._M_p = (pointer)&targetNames.ImportLibrary.field_2;
  targetNames.ImportLibrary._M_string_length = 0;
  targetNames.ImportLibrary.field_2._M_local_buf[0] = '\0';
  targetNames.PDB._M_dataplus._M_p = (pointer)&targetNames.PDB.field_2;
  targetNames.PDB._M_string_length = 0;
  targetNames.PDB.field_2._M_local_buf[0] = '\0';
  targetNames.SharedObject._M_dataplus._M_p = (pointer)&targetNames.SharedObject.field_2;
  targetNames.SharedObject._M_string_length = 0;
  targetNames.SharedObject.field_2._M_local_buf[0] = '\0';
  TVar1 = this->Target->TargetTypeValue;
  if (TVar1 - STATIC_LIBRARY < 3) {
    GetLibraryNames((Names *)&dir,this,config);
  }
  else {
    if (TVar1 != EXECUTABLE) goto LAB_002f1c2e;
    GetExecutableNames((Names *)&dir,this,config);
  }
  Names::operator=(&targetNames,(Names *)&dir);
  Names::~Names((Names *)&dir);
  GetDirectory(&dir,this,config,RuntimeBinaryArtifact);
  f._M_dataplus._M_p = (pointer)&f.field_2;
  f._M_string_length = 0;
  f.field_2._M_local_buf[0] = '\0';
  if (targetNames.Output._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.SharedObject._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.Real._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.PDB._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.ImportLibrary._M_string_length != 0) {
    GetDirectory(&local_100,this,config,ImportLibraryArtifact);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&dir);
LAB_002f1c2e:
  Names::~Names(&targetNames);
  return;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}